

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

uint __thiscall ON_FixedSizePool::MaximumElementId(ON_FixedSizePool *this,size_t id_offset)

{
  uint local_3c;
  uint i1;
  uint maximum_id;
  char *next_block;
  char *block_end;
  char *block;
  size_t id_offset_local;
  ON_FixedSizePool *this_local;
  
  local_3c = 0;
  if (id_offset < 8) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x3d3,"","id_offset is too small.");
    this_local._4_4_ = 0;
  }
  else if (this->m_sizeof_element < id_offset + 4) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x3d9,"","id_offset is too large.");
    this_local._4_4_ = 0;
  }
  else {
    block_end = (char *)this->m_first_block;
    while (block_end != (char *)0x0) {
      if (block_end == (char *)this->m_al_block) {
        _i1 = (char *)0x0;
        next_block = (char *)this->m_al_element_array;
      }
      else {
        _i1 = *(char **)block_end;
        next_block = *(char **)(block_end + 8);
      }
      if (local_3c < *(uint *)(next_block + -(this->m_sizeof_element - id_offset))) {
        local_3c = *(uint *)(next_block + -(this->m_sizeof_element - id_offset));
      }
      block_end = _i1;
    }
    this_local._4_4_ = local_3c;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_FixedSizePool::MaximumElementId(
  size_t id_offset
) const
{
  const char* block;
  const char* block_end;
  const char* next_block;
  unsigned int maximum_id = 0;
  if (id_offset < sizeof(void*))
  {
    // caller is confused.
    ON_ERROR("id_offset is too small.");
    return 0;
  }
  if (id_offset + sizeof(maximum_id) > m_sizeof_element)
  {
    // caller is confused.
    ON_ERROR("id_offset is too large.");
    return 0;
  }

  for (block = (const char*)m_first_block; 0 != block; block = next_block)
  {
    if (block == m_al_block)
    {
      next_block = nullptr;
      block_end = (const char*)m_al_element_array;
      block += (2 * sizeof(void*));
    }
    else
    {
      next_block = *((const char**)block);
      block += sizeof(void*);
      block_end = *((const char**)(block));
      block += sizeof(void*);
    }

    unsigned int i1 = *((const unsigned int*)(block_end-(m_sizeof_element-id_offset)));
    if (i1 > maximum_id)
      maximum_id = i1;
  }

  return maximum_id;
}